

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void CheckApplyEnclosesArgs
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,ApplyCheck *applyCheck)

{
  bool bVar1;
  ParseNodeName *pPVar2;
  ParseNodeCall *pPVar3;
  Symbol *sym;
  ApplyCheck *applyCheck_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  if ((pnode != (ParseNode *)0x0) && ((applyCheck->matches & 1U) != 0)) {
    if (pnode->nop == knopName) {
      pPVar2 = ParseNode::AsParseNodeName(pnode);
      if (((pPVar2->sym != (Symbol *)0x0) && (bVar1 = Symbol::IsArguments(pPVar2->sym), bVar1)) &&
         ((applyCheck->insideApplyCall & 1U) == 0)) {
        applyCheck->matches = false;
      }
    }
    else if ((pnode->nop == knopCall) && ((pnode->field_0x1 & 1) == 0)) {
      pPVar3 = ParseNode::AsParseNodeCall(pnode);
      bVar1 = IsApplyArgs(pPVar3);
      if (bVar1) {
        if ((applyCheck->insideApplyCall & 1U) == 0) {
          applyCheck->insideApplyCall = true;
          applyCheck->sawApply = true;
          pPVar3 = ParseNode::AsParseNodeCall(pnode);
          pPVar3->field_0x24 = pPVar3->field_0x24 & 0xfd | 2;
        }
        else {
          applyCheck->matches = false;
        }
      }
    }
  }
  return;
}

Assistant:

void CheckApplyEnclosesArgs(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, ApplyCheck* applyCheck)
{
    if ((pnode == nullptr) || (!applyCheck->matches))
    {
        return;
    }

    switch (pnode->nop)
    {
    case knopName:
    {
        Symbol* sym = pnode->AsParseNodeName()->sym;
        if (sym != nullptr)
        {
            if (sym->IsArguments())
            {
                if (!applyCheck->insideApplyCall)
                {
                    applyCheck->matches = false;
                }
            }
        }
        break;
    }

    case knopCall:
        if ((!pnode->isUsed) && IsApplyArgs(pnode->AsParseNodeCall()))
        {
            // no nested apply calls
            if (applyCheck->insideApplyCall)
            {
                applyCheck->matches = false;
            }
            else
            {
                applyCheck->insideApplyCall = true;
                applyCheck->sawApply = true;
                pnode->AsParseNodeCall()->isApplyCall = true;
            }
        }
        break;
    }
}